

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_DACCtrl_SetFrequency(VGMPlayer *this)

{
  UINT32 UVar1;
  reference pvVar2;
  DACSTRM_DEV *dacStrm;
  size_t dsID;
  VGMPlayer *this_local;
  
  if (this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]] != 0xffffffffffffffff) {
    pvVar2 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::
             operator[](&this->_dacStreams,
                        this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]]);
    UVar1 = ReadLE32(this->_fileData + (ulong)this->_filePos + 2);
    pvVar2->freq = UVar1;
    daccontrol_set_frequency((pvVar2->defInf).dataPtr,pvVar2->freq);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_SetFrequency(void)	// DAC Stream Control: Set Frequency
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
		return;
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	
	dacStrm->freq = ReadLE32(&fData[0x02]);
	daccontrol_set_frequency(dacStrm->defInf.dataPtr, dacStrm->freq);
	return;
}